

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

void insertions(BamReader *br,RefVector *ref,int bpRegion,
               vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersUp,
               vector<SoftCluster,_std::allocator<SoftCluster>_> *scClustersDown,string *folderPath)

{
  pointer pSVar1;
  int refID;
  pointer pSVar2;
  pointer pSVar3;
  uint uVar4;
  int iVar5;
  const_reference pvVar6;
  int iVar7;
  pointer pSVar8;
  ulong uVar9;
  ulong __n;
  SoftCluster scUp;
  
  pSVar1 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar8 = (scClustersUp->super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                _M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar1; pSVar8 = pSVar8 + 1) {
    SoftCluster::SoftCluster(&scUp,pSVar8);
    uVar4 = getIdx(scUp.info.scPos + -0x1e,scClustersDown);
    if (uVar4 != 0xffffffff) {
      __n = (ulong)uVar4;
      iVar7 = 0;
      uVar9 = 0xffffffffffffffff;
      while ((__n < (ulong)(((long)(scClustersDown->
                                   super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(scClustersDown->
                                  super__Vector_base<SoftCluster,_std::allocator<SoftCluster>_>).
                                  _M_impl.super__Vector_impl_data._M_start) / 0x90) &&
             (pvVar6 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                                 (scClustersDown,__n), (pvVar6->info).scPos - scUp.info.scPos < 0x1f
             ))) {
        pvVar6 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at(scClustersDown,__n);
        pSVar3 = scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pSVar2 = scUp.nodes.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = iVar7;
        if (-0x1f < (pvVar6->info).scPos - scUp.info.scPos) {
          scClustersUp = (vector<SoftCluster,_std::allocator<SoftCluster>_> *)
                         std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                                   (scClustersDown,__n);
          iVar5 = (int)(((long)(((const_reference)scClustersUp)->nodes).
                               super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(((const_reference)scClustersUp)->nodes).
                              super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                              super__Vector_impl_data._M_start) / 0x78) +
                  (int)(((long)pSVar3 - (long)pSVar2) / 0x78);
          if (iVar7 < iVar5) {
            uVar9 = __n;
          }
          uVar9 = uVar9 & 0xffffffff;
          if (iVar5 < iVar7) {
            iVar5 = iVar7;
          }
        }
        iVar7 = iVar5;
        __n = __n + 1;
      }
      iVar7 = scUp.info.scPos;
      if ((int)uVar9 != -1) {
        pvVar6 = std::vector<SoftCluster,_std::allocator<SoftCluster>_>::at
                           (scClustersDown,(long)(int)uVar9);
        refID = scUp.info.refID;
        iVar5 = (pvVar6->info).scPos;
        std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                  (ref,(long)scUp.info.refID);
        pvVar6 = (const_reference)folderPath;
        writeReads(br,ref,refID,(string *)scClustersUp,iVar7,iVar5,bpRegion,folderPath);
        scClustersUp = (vector<SoftCluster,_std::allocator<SoftCluster>_> *)pvVar6;
      }
    }
    SoftCluster::~SoftCluster(&scUp);
  }
  return;
}

Assistant:

void insertions(BamTools::BamReader &br, const BamTools::RefVector &ref, const int bpRegion, const std::vector<SoftCluster> &scClustersUp, const std::vector<SoftCluster> &scClustersDown, const std::string &folderPath)
{
	for (SoftCluster scUp : scClustersUp)
	{
		int stBound = getIdx(scUp.info.scPos + MIN_INS_DIFF_CLUSTERS, scClustersDown);
		if (stBound == -1)
			continue;

		int bestIdx = -1, bestSup = 0;
		for (int i = stBound; i < scClustersDown.size(); ++i)
		{
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos > MAX_INS_DIFF_CLUSTERS)
				break;
			if (scClustersDown.at(i).info.scPos - scUp.info.scPos < MIN_INS_DIFF_CLUSTERS)
				continue;
			int curSup = scUp.nodes.size() + scClustersDown.at(i).nodes.size();
			if (curSup > bestSup)
			{
				bestSup = curSup;
				bestIdx = i;
			}
		}
		if (bestIdx != -1)
		{
			int st = scUp.info.scPos;
			int en = scClustersDown.at(bestIdx).info.scPos;
			writeReads(br, ref, scUp.info.refID, ref.at(scUp.info.refID).RefName, st, en, bpRegion, folderPath);
		}
	}
}